

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_textedit_find_charpos
               (nk_text_find *find,nk_text_edit *state,int n,int single_line,nk_user_font *font,
               float row_height)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  int len;
  nk_text_edit_row r;
  int local_5c;
  nk_text_edit_row local_58;
  nk_rune local_34;
  
  iVar4 = (state->string).len;
  local_58.x0 = 0.0;
  local_58.x1 = 0.0;
  local_58.baseline_y_delta = 0.0;
  local_58.ymin = 0.0;
  local_58.ymax = 0.0;
  local_58.num_chars = 0;
  if (iVar4 == n) {
    iVar3 = 0;
    nk_textedit_layout_row(&local_58,state,0,row_height,font);
    if (single_line == 0) {
      iVar2 = 0;
      if (iVar4 < 1) {
        iVar3 = 0;
      }
      else {
        do {
          iVar3 = iVar2;
          iVar2 = local_58.num_chars + iVar3;
          nk_textedit_layout_row(&local_58,state,iVar2,row_height,font);
        } while (iVar2 < iVar4);
      }
      find->first_char = iVar2;
      iVar4 = local_58.num_chars;
    }
    else {
      find->first_char = 0;
    }
    find->length = iVar4;
    find->x = local_58.x1;
    find->y = local_58.ymin;
    find->height = local_58.ymax - local_58.ymin;
    find->prev_first = iVar3;
  }
  else {
    find->y = 0.0;
    iVar4 = 0;
    nk_textedit_layout_row(&local_58,state,0,row_height,font);
    if (n < local_58.num_chars) {
      iVar2 = 0;
    }
    else {
      iVar3 = local_58.num_chars;
      iVar4 = 0;
      do {
        iVar2 = iVar4;
        iVar4 = iVar3;
        find->y = local_58.baseline_y_delta + find->y;
        nk_textedit_layout_row(&local_58,state,iVar4,row_height,font);
        iVar3 = local_58.num_chars + iVar4;
      } while (local_58.num_chars + iVar4 <= n);
    }
    find->first_char = iVar4;
    find->length = local_58.num_chars;
    find->height = local_58.ymax - local_58.ymin;
    find->prev_first = iVar2;
    find->x = local_58.x0;
    if (iVar4 < n) {
      do {
        local_5c = 0;
        local_34 = 0;
        pcVar1 = nk_str_at_const(&state->string,iVar4,&local_34,&local_5c);
        fVar5 = (*font->width)(font->userdata,font->height,pcVar1,local_5c);
        find->x = fVar5 + find->x;
        iVar4 = iVar4 + 1;
      } while (n != iVar4);
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_find_charpos(struct nk_text_find *find, struct nk_text_edit *state,
    int n, int single_line, const struct nk_user_font *font, float row_height)
{
    /* find the x/y location of a character, and remember info about the previous
     * row in case we get a move-up event (for page up, we'll have to rescan) */
    struct nk_text_edit_row r;
    int prev_start = 0;
    int z = state->string.len;
    int i=0, first;

    nk_zero_struct(r);
    if (n == z) {
        /* if it's at the end, then find the last line -- simpler than trying to
        explicitly handle this case in the regular code */
        nk_textedit_layout_row(&r, state, 0, row_height, font);
        if (single_line) {
            find->first_char = 0;
            find->length = z;
        } else {
            while (i < z) {
                prev_start = i;
                i += r.num_chars;
                nk_textedit_layout_row(&r, state, i, row_height, font);
            }

            find->first_char = i;
            find->length = r.num_chars;
        }
        find->x = r.x1;
        find->y = r.ymin;
        find->height = r.ymax - r.ymin;
        find->prev_first = prev_start;
        return;
    }

    /* search rows to find the one that straddles character n */
    find->y = 0;

    for(;;) {
        nk_textedit_layout_row(&r, state, i, row_height, font);
        if (n < i + r.num_chars) break;
        prev_start = i;
        i += r.num_chars;
        find->y += r.baseline_y_delta;
    }

    find->first_char = first = i;
    find->length = r.num_chars;
    find->height = r.ymax - r.ymin;
    find->prev_first = prev_start;

    /* now scan to find xpos */
    find->x = r.x0;
    for (i=0; first+i < n; ++i)
        find->x += nk_textedit_get_width(state, first, i, font);
}